

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
TargetExistsNode::Evaluate
          (string *__return_storage_ptr__,TargetExistsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  cmTarget *pcVar4;
  char *pcVar5;
  char *pcVar6;
  string targetName;
  string local_88;
  string local_68;
  string local_48;
  
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x20) {
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,pcVar2 + pbVar1->_M_string_length);
    if ((local_88._M_string_length == 0) ||
       (bVar3 = cmGeneratorExpression::IsValidTargetName(&local_88), !bVar3)) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,content);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "$<TARGET_EXISTS:tgt> expression requires a non-empty valid target name.","");
      reportError(context,&local_68,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      pcVar4 = cmMakefile::FindTargetToUse(context->LG->Makefile,&local_88,false);
      pcVar6 = "1";
      if (pcVar4 == (cmTarget *)0x0) {
        pcVar6 = "0";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "";
      if (pcVar4 == (cmTarget *)0x0) {
        pcVar5 = "";
      }
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar6,pcVar5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_88,content);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"$<TARGET_EXISTS:...> expression requires one parameter","");
  reportError(context,&local_88,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    if (parameters.size() != 1) {
      reportError(context, content->GetOriginalExpression(),
                  "$<TARGET_EXISTS:...> expression requires one parameter");
      return std::string();
    }

    std::string targetName = parameters.front();
    if (targetName.empty() ||
        !cmGeneratorExpression::IsValidTargetName(targetName)) {
      reportError(context, content->GetOriginalExpression(),
                  "$<TARGET_EXISTS:tgt> expression requires a non-empty "
                  "valid target name.");
      return std::string();
    }

    return context->LG->GetMakefile()->FindTargetToUse(targetName) ? "1" : "0";
  }